

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINGetNumLinFuncEvals(void *kinmem,long *nfevals)

{
  KINLsMem pKStack_30;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  long *nfevals_local;
  void *kinmem_local;
  
  kin_mem = (KINMem)nfevals;
  nfevals_local = (long *)kinmem;
  kinmem_local._4_4_ =
       kinLs_AccessLMem(kinmem,"KINGetNumLinFuncEvals",(KINMem *)&kinls_mem,&stack0xffffffffffffffd0
                       );
  if (kinmem_local._4_4_ == 0) {
    kin_mem->kin_uround = (realtype)pKStack_30->nfeDQ;
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINGetNumLinFuncEvals(void *kinmem, long int *nfevals)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure; set output value and return */
  retval = kinLs_AccessLMem(kinmem, "KINGetNumLinFuncEvals",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);
  *nfevals = kinls_mem->nfeDQ;
  return(KINLS_SUCCESS);
}